

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

void bcread_dbg(LexState *ls,GCproto *pt,MSize sizedbg)

{
  uint uVar1;
  void *q;
  uint uVar2;
  uint32_t *p_1;
  uint16_t *p;
  MSize n;
  MSize i;
  void *lineinfo;
  MSize sizedbg_local;
  GCproto *pt_local;
  LexState *ls_local;
  
  q = (void *)(pt->lineinfo).ptr64;
  bcread_block(ls,q,sizedbg);
  if (((ls->level & 1) != 0) && (0xff < pt->numline)) {
    uVar2 = pt->sizebc - 1;
    if (pt->numline < 0x10000) {
      for (p._4_4_ = 0; p._4_4_ < uVar2; p._4_4_ = p._4_4_ + 1) {
        *(ushort *)((long)q + (ulong)p._4_4_ * 2) =
             *(ushort *)((long)q + (ulong)p._4_4_ * 2) >> 8 |
             *(short *)((long)q + (ulong)p._4_4_ * 2) << 8;
      }
    }
    else {
      for (p._4_4_ = 0; p._4_4_ < uVar2; p._4_4_ = p._4_4_ + 1) {
        uVar1 = *(uint *)((long)q + (ulong)p._4_4_ * 4);
        *(uint *)((long)q + (ulong)p._4_4_ * 4) =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      }
    }
  }
  return;
}

Assistant:

static void bcread_dbg(LexState *ls, GCproto *pt, MSize sizedbg)
{
  void *lineinfo = (void *)proto_lineinfo(pt);
  bcread_block(ls, lineinfo, sizedbg);
  /* Swap lineinfo if the endianess differs. */
  if (bcread_swap(ls) && pt->numline >= 256) {
    MSize i, n = pt->sizebc-1;
    if (pt->numline < 65536) {
      uint16_t *p = (uint16_t *)lineinfo;
      for (i = 0; i < n; i++) p[i] = (uint16_t)((p[i] >> 8)|(p[i] << 8));
    } else {
      uint32_t *p = (uint32_t *)lineinfo;
      for (i = 0; i < n; i++) p[i] = lj_bswap(p[i]);
    }
  }
}